

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::
     ParseUniformEnumProperty<tinyusdz::CollectionInstance::ExpansionRule,tinyusdz::CollectionInstance::ExpansionRule>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::CollectionInstance::ExpansionRule> *enum_handler,
               Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *result,
               string *warn,string *err)

{
  anon_struct_8_0_00000001_for___align aVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vtable_type *pvVar3;
  bool bVar4;
  uint32_t uVar5;
  ostream *poVar6;
  long *plVar7;
  Attribute *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *args_1;
  expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  ostringstream ss_e;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined8 uStack_220;
  string *local_218;
  undefined1 local_210 [32];
  bool local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  optional<tinyusdz::Token> local_1a8 [2];
  ios_base local_138 [264];
  
  if (result == (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
               ,0x5a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x644);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"[Internal error] `result` arg is nullptr.",0x29);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_0028c4aa;
    ::std::__cxx11::stringbuf::str();
    plVar7 = (long *)::std::__cxx11::string::_M_append(local_210,(ulong)(err->_M_dataplus)._M_p);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_230._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_230._8_8_ = plVar7[3];
      local_240._0_8_ = &local_230;
    }
    else {
      local_230._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_240._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar7 + 1);
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_210._0_8_ == local_210 + 0x10) goto LAB_0028c4aa;
  }
  else {
    args = attr;
    args_1 = result;
    local_218 = prop_name;
    bVar4 = Attribute::is_connection(attr);
    if (bVar4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x648);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar11 = 
      "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}";
      pcVar9 = "";
LAB_0028c1f5:
      local_210._0_8_ = local_210 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_210,pcVar11,pcVar9);
      fmt::format<std::__cxx11::string>
                ((string *)local_240,(fmt *)local_210,(string *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._0_8_ != &local_230) {
        operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
LAB_0028c266:
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
    }
    else {
      if (attr->_variability == Uniform) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar3 = (attr->_var)._value.v_.vtable;
          if (pvVar3 == (vtable_type *)0x0) {
            bVar4 = false;
          }
          else {
            uVar5 = (*pvVar3->type_id)();
            bVar4 = uVar5 == 4;
          }
          if ((bVar4) || (((attr->_var)._blocked & 1U) != 0)) {
LAB_0028ca2c:
            result->_blocked = true;
            return true;
          }
        }
        bVar4 = primvar::PrimVar::is_timesamples(&attr->_var);
        if (!bVar4) {
          Attribute::get_value<tinyusdz::Token>(local_1a8,attr);
          local_240[0] = (string)local_1a8[0].has_value_;
          if (local_1a8[0].has_value_ == true) {
            local_240._8_8_ = (long)local_230._M_local_buf + 8;
            aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_1a8[0].contained + 0x10);
            if ((anon_struct_8_0_00000001_for___align)local_1a8[0].contained._0_8_ == aVar1) {
              uStack_220 = local_1a8[0].contained._24_8_;
            }
            else {
              local_240._8_8_ = local_1a8[0].contained.data.__align;
            }
            local_230._9_7_ = local_1a8[0].contained._17_7_;
            local_230._M_local_buf[8] = local_1a8[0].contained._16_1_;
            local_230._M_allocated_capacity = local_1a8[0].contained._8_8_;
            local_1a8[0].contained._8_8_ = 0;
            local_1a8[0].contained._16_1_ = 0;
            local_1a8[0].contained._0_8_ = aVar1;
          }
          if (local_1a8[0].has_value_ == true) {
            if ((enum_handler->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_0028d152;
            (*enum_handler->_M_invoker)
                      ((expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_210,(_Any_data *)enum_handler,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_240 + 8));
            if (local_1f0 == true) goto LAB_0028cabe;
            if (strict_allowedToken_check) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar10 = 0x65e;
              goto LAB_0028cd67;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar10 = 0x660;
LAB_0028cfa6:
            poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,iVar10);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            paVar2 = &local_1e8.field_2;
            local_1e8._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,
                       "Attribute `{}`: `{}` is not an allowed token. Ignore it.","");
            if (local_240[0] == (string)0x0) {
LAB_0028d157:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,
                            "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                           );
            }
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_1c8,(fmt *)&local_1e8,local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_240 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                local_1c8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != paVar2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (warn != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_1c8,&local_1e8,err);
              ::std::__cxx11::string::operator=((string *)warn,(string *)&local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            result->_empty = true;
            bVar4 = true;
            goto LAB_0028d101;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar10 = 0x665;
          goto LAB_0028cb62;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x655);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar11 = 
        "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.";
        pcVar9 = "";
        goto LAB_0028c1f5;
      }
      bVar4 = primvar::PrimVar::is_scalar(&attr->_var);
      if (bVar4) {
        if ((attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (attr->_var)._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar3 = (attr->_var)._value.v_.vtable;
          if (pvVar3 == (vtable_type *)0x0) {
            bVar4 = false;
          }
          else {
            uVar5 = (*pvVar3->type_id)();
            bVar4 = uVar5 == 4;
          }
          if ((bVar4) || (((attr->_var)._blocked & 1U) != 0)) goto LAB_0028ca2c;
        }
        Attribute::get_value<tinyusdz::Token>(local_1a8,attr);
        local_240[0] = (string)local_1a8[0].has_value_;
        if (local_1a8[0].has_value_ == true) {
          local_240._8_8_ = (long)local_230._M_local_buf + 8;
          aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_1a8[0].contained + 0x10);
          if ((anon_struct_8_0_00000001_for___align)local_1a8[0].contained._0_8_ == aVar1) {
            uStack_220 = local_1a8[0].contained._24_8_;
          }
          else {
            local_240._8_8_ = local_1a8[0].contained.data.__align;
          }
          local_230._9_7_ = local_1a8[0].contained._17_7_;
          local_230._M_local_buf[8] = local_1a8[0].contained._16_1_;
          local_230._M_allocated_capacity = local_1a8[0].contained._8_8_;
          local_1a8[0].contained._8_8_ = 0;
          local_1a8[0].contained._16_1_ = 0;
          local_1a8[0].contained._0_8_ = aVar1;
        }
        if (local_1a8[0].has_value_ == true) {
          if ((enum_handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0028d152:
            ::std::__throw_bad_function_call();
          }
          (*enum_handler->_M_invoker)
                    ((expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_210,(_Any_data *)enum_handler,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_240 + 8));
          if (local_1f0 == true) {
LAB_0028cabe:
            (result->_attrib).contained =
                 (storage_t<tinyusdz::CollectionInstance::ExpansionRule>)local_210._0_4_;
            bVar4 = true;
            if ((result->_attrib).has_value_ == false) {
              (result->_attrib).has_value_ = true;
            }
          }
          else {
            if (!strict_allowedToken_check) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar10 = 0x67a;
              goto LAB_0028cfa6;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar10 = 0x678;
LAB_0028cd67:
            poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,iVar10);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            paVar2 = &local_1e8.field_2;
            local_1e8._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"Attribute `{}`: `{}` is not an allowed token.","");
            if (local_240[0] == (string)0x0) goto LAB_0028d157;
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_1c8,(fmt *)&local_1e8,local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_240 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                local_1c8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != paVar2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+(&local_1c8,&local_1e8,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar4 = false;
          }
LAB_0028d101:
          if ((local_1f0 == false) && ((undefined1 *)local_210._0_8_ != local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          goto LAB_0028d123;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar10 = 0x67f;
LAB_0028cb62:
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,iVar10);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        paVar2 = &local_1c8.field_2;
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,
                   "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                   ,"");
        Attribute::type_name_abi_cxx11_(&local_1e8,attr);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_210,(fmt *)&local_1c8,local_218,&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_210._0_8_,local_210._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210,&local_1c8,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_210);
          if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        bVar4 = false;
LAB_0028d123:
        if (local_240[0] != (string)0x1) {
          return bVar4;
        }
        if (local_240._8_8_ == (long)local_230._M_local_buf + 8) {
          return bVar4;
        }
        operator_delete((void *)local_240._8_8_,local_230._8_8_ + 1);
        return bVar4;
      }
      bVar4 = primvar::PrimVar::is_timesamples(&attr->_var);
      if (bVar4) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x683);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar11 = "Attribute `{}` is uniform variability, but TimeSampled value is authored.";
        pcVar9 = "";
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseUniformEnumProperty",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x686);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar11 = "Internal error. Attribute `{}` is invalid";
        pcVar9 = "";
      }
      local_210._0_8_ = local_210 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_210,pcVar11,pcVar9);
      fmt::format<std::__cxx11::string>
                ((string *)local_240,(fmt *)local_210,(string *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._0_8_ != &local_230) {
        operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) goto LAB_0028c266;
    }
    if (err == (string *)0x0) goto LAB_0028c4aa;
    ::std::__cxx11::stringbuf::str();
    plVar7 = (long *)::std::__cxx11::string::_M_append(local_210,(ulong)(err->_M_dataplus)._M_p);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar8) {
      local_230._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_230._8_8_ = plVar7[3];
      local_240._0_8_ = &local_230;
    }
    else {
      local_230._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_240._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_240._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar7 + 1);
    *plVar7 = (long)paVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)err,(string *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_210._0_8_ == local_210 + 0x10) goto LAB_0028c4aa;
  }
  operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
LAB_0028c4aa:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ParseUniformEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<T> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // uniform or TimeSamples
    if (attr.get_var().is_scalar()) {

      if (attr.is_blocked()) {
        result->set_blocked(true);
        return true;
      }

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          (*result) = e.value();
          return true;
        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          result->set_value_empty();
          return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    } else if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is uniform variability, but TimeSampled value is authored.",
 prop_name);

    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Attribute `{}` is invalid", prop_name);
    }

  }

  return false;
}